

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O2

void AI::encodeEngramIfUnique
               (Stimulus stimulus,vector<AI::Engram,_std::allocator<AI::Engram>_> *engrams)

{
  float fVar1;
  pointer pEVar2;
  Stimulus SVar3;
  iterator __begin2;
  pointer pEVar4;
  iterator __end2;
  bool bVar5;
  value_type local_38;
  
  SVar3 = stimulus;
  pEVar4 = (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (stimulus.type == Auditory) {
    bVar5 = false;
    for (; pEVar4 != pEVar2; pEVar4 = pEVar4 + 1) {
      if ((pEVar4->type == Heard) &&
         ((pEVar4->stimulus).field_3.visual.tag == stimulus.field_3.visual.tag)) {
        fVar1 = (pEVar4->stimulus).x;
        if ((fVar1 == stimulus.x) && (!NAN(fVar1) && !NAN(stimulus.x))) {
          fVar1 = (pEVar4->stimulus).y;
          if ((fVar1 == stimulus.y) && (!NAN(fVar1) && !NAN(stimulus.y))) {
            bVar5 = true;
          }
        }
      }
    }
    if (bVar5) {
      return;
    }
    local_38.type = Heard;
    local_38.age = 0;
  }
  else {
    bVar5 = false;
    for (; pEVar4 != pEVar2; pEVar4 = pEVar4 + 1) {
      if ((pEVar4->type == Saw) &&
         ((pEVar4->stimulus).field_3.visual.tag == stimulus.field_3.visual.tag)) {
        fVar1 = (pEVar4->stimulus).x;
        if ((fVar1 == stimulus.x) && (!NAN(fVar1) && !NAN(stimulus.x))) {
          fVar1 = (pEVar4->stimulus).y;
          if ((fVar1 == stimulus.y) && (!NAN(fVar1) && !NAN(stimulus.y))) {
            bVar5 = (bool)(bVar5 | (pEVar4->stimulus).field_3.visual.target ==
                                   stimulus.field_3.visual.target);
          }
        }
      }
    }
    if (bVar5) {
      return;
    }
    local_38.type = Saw;
    local_38.age = 0;
  }
  local_38.stimulus._0_8_ = stimulus._0_8_;
  local_38.stimulus.field_3._0_8_ = stimulus.field_3._0_8_;
  local_38.stimulus.intensity = stimulus.intensity;
  local_38.stimulus._12_4_ = stimulus._12_4_;
  local_38.stimulus.field_3.visual.target = stimulus.field_3.visual.target;
  local_38.stimulus._32_8_ = SVar3._32_8_;
  std::vector<AI::Engram,_std::allocator<AI::Engram>_>::push_back(engrams,&local_38);
  return;
}

Assistant:

void encodeEngramIfUnique(Stimulus stimulus, std::vector<Engram>& engrams)
	{		
		if (stimulus.type == StimulusType::Auditory)
		{
			bool heardBefore = false;

			for(auto& engram : engrams)
			{
				if (engram.type == EngramType::Heard)
				{					
					if (engram.stimulus.auditory.tag == stimulus.auditory.tag
						&& (engram.stimulus.x == stimulus.x
							&& engram.stimulus.y == stimulus.y))
					{
						heardBefore = true;						
					}					
				}
			}

			if (!heardBefore)
			{
				Engram engram;
				engram.type = EngramType::Heard;
				engram.age = 0;
				engram.stimulus = stimulus;

				engrams.push_back(engram);
			}
		}
		else 
		{
			bool seenBefore = false;

			for(auto& engram : engrams)
			{
				if (engram.type == EngramType::Saw)
				{
					if (engram.stimulus.visual.tag == stimulus.visual.tag
						&& (engram.stimulus.x == stimulus.x
							&& engram.stimulus.y == stimulus.y)
						&& engram.stimulus.visual.target == stimulus.visual.target)
					{
						seenBefore = true;
					}
				}
			}

			if (!seenBefore)
			{
				Engram engram;
				engram.type = EngramType::Saw;
				engram.age = 0;
				engram.stimulus = stimulus;

				engrams.push_back(engram);
			}
		}		
	}